

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixFile_Lock(void *pUserData,int lock_type)

{
  int iVar1;
  undefined4 local_1c;
  int rc;
  int fd;
  int lock_type_local;
  void *pUserData_local;
  
  if (lock_type < 0) {
    local_1c = flock((ulong)pUserData & 0xffffffff,8);
  }
  else if (lock_type == 1) {
    local_1c = flock((ulong)pUserData & 0xffffffff,2);
  }
  else {
    local_1c = flock((ulong)pUserData & 0xffffffff,1);
  }
  iVar1 = -1;
  if (local_1c == 0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int UnixFile_Lock(void *pUserData, int lock_type)
{
	int fd = SX_PTR_TO_INT(pUserData);
	int rc = JX9_OK; /* cc warning */
	if( lock_type < 0 ){
		/* Unlock the file */
		rc = flock(fd, LOCK_UN);
	}else{
		if( lock_type == 1 ){
			/* Exculsive lock */
			rc = flock(fd, LOCK_EX);
		}else{
			/* Shared lock */
			rc = flock(fd, LOCK_SH);
		}
	}
	return !rc ? JX9_OK : -1;
}